

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Image * vera::fade(Image *__return_storage_ptr__,Image *_A,Image *_B,float _pct)

{
  long lVar1;
  pointer ptVar2;
  int iVar3;
  int iVar4;
  int _channels;
  uint uVar5;
  ostream *poVar6;
  long lVar7;
  pointer *__ptr;
  long lVar8;
  ulong uVar9;
  thread *thrd_1;
  pointer ptVar10;
  thread thrd;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  long *local_88;
  Image *local_80;
  thread local_78;
  float local_6c;
  vector<std::thread,_std::allocator<std::thread>_> local_68;
  ulong local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  local_6c = _pct;
  iVar3 = (*_A->_vptr_Image[6])(_A);
  iVar4 = (*_A->_vptr_Image[7])(_A);
  _channels = (*_A->_vptr_Image[8])(_A);
  local_80 = __return_storage_ptr__;
  Image::Image(__return_storage_ptr__,iVar3,iVar4,_channels);
  iVar3 = (*_A->_vptr_Image[6])(_A);
  iVar4 = (*_B->_vptr_Image[6])(_B);
  if (iVar3 == iVar4) {
    iVar3 = (*_A->_vptr_Image[7])(_A);
    iVar4 = (*_B->_vptr_Image[7])(_B);
    if (iVar3 == iVar4) {
      iVar3 = (*_A->_vptr_Image[8])(_A);
      iVar4 = (*_B->_vptr_Image[8])(_B);
      if (iVar3 == iVar4) {
        local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar5 = std::thread::hardware_concurrency();
        iVar3 = (*_A->_vptr_Image[7])(_A);
        iVar4 = (*_A->_vptr_Image[7])(_A);
        ptVar10 = local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar2 = local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (0 < (int)uVar5) {
          local_38 = (long)(iVar3 / (int)uVar5);
          local_40 = (ulong)(uVar5 - 1);
          local_50 = (ulong)uVar5;
          local_48 = (long)(iVar4 % (int)uVar5);
          uVar9 = 0;
          lVar8 = 0;
          do {
            local_78._M_id._M_thread = (id)0;
            local_88 = (long *)operator_new(0x38);
            lVar7 = 0;
            if (local_40 == uVar9) {
              lVar7 = local_48;
            }
            lVar1 = local_38 + lVar8;
            *local_88 = (long)&PTR___State_003ec3a0;
            local_88[1] = (long)local_80;
            local_88[2] = (long)_A;
            local_88[3] = (long)_B;
            local_88[4] = lVar8;
            local_88[5] = lVar7 + lVar1;
            *(float *)(local_88 + 6) = local_6c;
            std::thread::_M_start_thread(&local_78,&local_88,0);
            if (local_88 != (long *)0x0) {
              (**(code **)(*local_88 + 8))();
            }
            std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                      (&local_68,&local_78);
            if (local_78._M_id._M_thread != 0) {
              std::terminate();
            }
            uVar9 = uVar9 + 1;
            lVar8 = lVar1;
            ptVar10 = local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                      .super__Vector_impl_data._M_start;
            ptVar2 = local_68.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          } while (local_50 != uVar9);
        }
        for (; ptVar10 != ptVar2; ptVar10 = ptVar10 + 1) {
          std::thread::join();
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_68);
        return local_80;
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Images can\'t be mixed because they have different sizes (",0x39
            );
  iVar3 = (*_A->_vptr_Image[6])(_A);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
  iVar3 = (*_A->_vptr_Image[7])(_A);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," vs ",4);
  iVar3 = (*_B->_vptr_Image[6])(_B);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
  iVar3 = (*_B->_vptr_Image[7])(_B);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return local_80;
}

Assistant:

Image fade(const Image& _A, const Image& _B, float _pct) {
    Image out = Image(_A.getWidth(), _A.getHeight(), _A.getChannels());

    if (_A.getWidth() != _B.getWidth() || _A.getHeight() != _B.getHeight() || _A.getChannels() != _B.getChannels()) {
        std::cout << "Images can't be mixed because they have different sizes (" << _A.getWidth() << "x" << _A.getHeight() << " vs " << _B.getWidth() << "x" << _B.getHeight() << ")" << std::endl;
        return out;
    }

    std::vector<std::thread> threads;
    const int nThreads = std::thread::hardware_concurrency();
    size_t pixelsPerThread = _A.getHeight() / nThreads;
    size_t pixelsLeftOver = _A.getHeight() % nThreads;
    for (int t = 0; t < nThreads; ++t) {
        size_t start = t * pixelsPerThread;
        size_t end = start + pixelsPerThread;
        if (t == nThreads - 1)
            end = start + pixelsPerThread + pixelsLeftOver;

        std::thread thrd( 
            [&out, &_A, &_B, start, end, _pct]() {
                for (size_t y = start; y < end; y++)
                for (size_t x = 0; x < _A.getWidth(); x++) {
                    size_t i = _A.getIndex(x, y);
                    out.setColor(i, glm::mix(_A.getColor(i), _B.getColor(i), _pct));
                }
            }
        );
        threads.push_back(std::move(thrd));
    }
    for (std::thread& thrd : threads)
        thrd.join();

    return out;
}